

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::toStream(ostream *s,bool in)

{
  void *pvVar1;
  byte in_SIL;
  void *in_RDI;
  
  pvVar1 = (void *)std::ostream::operator<<(in_RDI,std::boolalpha);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,(bool)(in_SIL & 1));
  std::ostream::operator<<(pvVar1,std::noboolalpha);
  return;
}

Assistant:

void toStream(std::ostream* s, bool in) { *s << std::boolalpha << in << std::noboolalpha; }